

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_sink.cc
# Opt level: O0

void __thiscall
google::protobuf::io::zc_sink_internal::ZeroCopyStreamByteSink::Append
          (ZeroCopyStreamByteSink *this,char *bytes,size_t len)

{
  size_t __n;
  uint uVar1;
  unsigned_long *puVar2;
  unsigned_long to_write;
  size_t sStack_20;
  int size;
  size_t len_local;
  char *bytes_local;
  ZeroCopyStreamByteSink *this_local;
  
  sStack_20 = len;
  len_local = (size_t)bytes;
  bytes_local = (char *)this;
  do {
    if ((this->failed_ & 1U) != 0 || sStack_20 == 0) {
      return;
    }
    if (this->buffer_size_ == 0) {
      uVar1 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])
                        (this->stream_,&this->buffer_,(long)&to_write + 4);
      if ((uVar1 & 1) == 0) {
        this->buffer_size_ = 0;
        this->failed_ = true;
        return;
      }
      this->buffer_size_ = (ulong)to_write._4_4_;
    }
    puVar2 = std::min<unsigned_long>(&stack0xffffffffffffffe0,&this->buffer_size_);
    __n = *puVar2;
    memcpy(this->buffer_,(void *)len_local,__n);
    this->buffer_ = (void *)((long)this->buffer_ + __n);
    this->buffer_size_ = this->buffer_size_ - __n;
    len_local = __n + len_local;
    sStack_20 = sStack_20 - __n;
    this->bytes_written_ = __n + this->bytes_written_;
  } while( true );
}

Assistant:

void ZeroCopyStreamByteSink::Append(const char* bytes, size_t len) {
  while (!failed_ && len > 0) {
    if (buffer_size_ == 0) {
      int size;
      if (!stream_->Next(&buffer_, &size)) {
        // There isn't a way for ByteSink to report errors.
        buffer_size_ = 0;
        failed_ = true;
        return;
      }
      buffer_size_ = static_cast<unsigned int>(size);
    }

    auto to_write = std::min(len, buffer_size_);
    memcpy(buffer_, bytes, to_write);

    buffer_ = static_cast<char*>(buffer_) + to_write;
    buffer_size_ -= to_write;

    bytes += to_write;
    len -= to_write;

    bytes_written_ += to_write;
  }
}